

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImVec2 IVar1;
  ImGuiID IVar2;
  ImGuiWindow *window;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  ImGuiContext *g;
  uint uVar9;
  bool bVar10;
  float fVar11;
  undefined1 auVar12 [16];
  
  pIVar5 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (((uint)flags >> 8 & 1) != 0) {
    if (out_hovered != (bool *)0x0) {
      *out_hovered = false;
    }
    if (out_held != (bool *)0x0) {
      *out_held = false;
    }
    if (pIVar5->ActiveId == id) {
      pIVar5->ActiveIdIsJustActivated = id != 0;
      if (id != 0) {
        pIVar5->ActiveIdTimer = 0.0;
      }
      pIVar5->ActiveId = 0;
      pIVar5->ActiveIdAllowNavDirFlags = 0;
      pIVar5->ActiveIdAllowOverlap = false;
      pIVar5->ActiveIdWindow = (ImGuiWindow *)0x0;
      return false;
    }
    return false;
  }
  uVar9 = flags | 2;
  if ((flags & 0x1eU) != 0) {
    uVar9 = flags;
  }
  pIVar3 = pIVar5->HoveredWindow;
  if (((uVar9 & 0x20) != 0) && (pIVar5->HoveredRootWindow == window)) {
    pIVar5->HoveredWindow = window;
  }
  bVar7 = ItemHoverable(bb,id);
  if (((((uVar9 >> 0xc & 1) == 0) || (pIVar5->DragDropActive != true)) ||
      ((pIVar5->DragDropSourceFlags & 4) != 0)) ||
     (bVar8 = IsItemHovered(0x20), pIVar6 = GImGui, !bVar8)) {
LAB_0014cdd0:
    bVar8 = false;
  }
  else {
    GImGui->HoveredId = id;
    pIVar6->HoveredIdAllowOverlap = false;
    fVar11 = 0.0;
    if ((id != 0) && (pIVar6->HoveredIdPreviousFrame == id)) {
      fVar11 = pIVar6->HoveredIdTimer + (pIVar6->IO).DeltaTime;
    }
    pIVar6->HoveredIdTimer = fVar11;
    fVar11 = pIVar5->HoveredIdTimer + 0.0001;
    if (((fVar11 != 0.0) || (NAN(fVar11))) &&
       ((bVar7 = true, fVar11 <= 0.01 ||
        (auVar12._0_4_ = fVar11 + -0.01, auVar12._4_4_ = (fVar11 - (pIVar5->IO).DeltaTime) + -0.01,
        auVar12._8_8_ = 0, auVar12 = divps(auVar12,_s_333_333__001aacc0),
        (int)auVar12._0_4_ <= (int)auVar12._4_4_)))) goto LAB_0014cdd0;
    FocusWindow(window);
    bVar8 = true;
    bVar7 = true;
  }
  if (((uVar9 & 0x20) != 0) && (pIVar5->HoveredRootWindow == window)) {
    pIVar5->HoveredWindow = pIVar3;
  }
  if (bVar7 == true && (uVar9 & 0x40) != 0) {
    if (pIVar5->HoveredIdPreviousFrame == 0 || pIVar5->HoveredIdPreviousFrame == id)
    goto LAB_0014ce1a;
LAB_0014ce0d:
    bVar7 = false;
  }
  else {
    if (bVar7 == false) goto LAB_0014ce0d;
LAB_0014ce1a:
    if (((uVar9 >> 10 & 1) == 0) ||
       ((((pIVar5->IO).KeyCtrl == false && ((pIVar5->IO).KeyShift == false)) &&
        ((pIVar5->IO).KeyAlt == false)))) {
      if (((uVar9 & 2) != 0) && ((pIVar5->IO).MouseClicked[0] == true)) {
        SetActiveID(id,window);
        if ((uVar9 >> 0xd & 1) == 0) {
          SetFocusID(id,window);
        }
        FocusWindow(window);
      }
      pIVar6 = GImGui;
      if ((((uVar9 & 4) != 0) && ((pIVar5->IO).MouseClicked[0] != false)) ||
         (((uVar9 & 0x10) != 0 && ((pIVar5->IO).MouseDoubleClicked[0] == true)))) {
        if ((uVar9 >> 0xb & 1) == 0) {
          SetActiveID(id,window);
        }
        else {
          bVar7 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar7;
          if (bVar7) {
            pIVar6->ActiveIdTimer = 0.0;
          }
          pIVar6->ActiveId = 0;
          pIVar6->ActiveIdAllowNavDirFlags = 0;
          pIVar6->ActiveIdAllowOverlap = false;
          pIVar6->ActiveIdWindow = (ImGuiWindow *)0x0;
        }
        FocusWindow(window);
        bVar8 = true;
      }
      pIVar6 = GImGui;
      if (((uVar9 & 8) != 0) && ((pIVar5->IO).MouseReleased[0] == true)) {
        if (((uVar9 & 1) == 0) ||
           ((pIVar5->IO).MouseDownDurationPrev[0] < (pIVar5->IO).KeyRepeatDelay)) {
          bVar8 = true;
        }
        bVar7 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar7;
        if (bVar7) {
          pIVar6->ActiveIdTimer = 0.0;
        }
        pIVar6->ActiveId = 0;
        pIVar6->ActiveIdAllowNavDirFlags = 0;
        pIVar6->ActiveIdAllowOverlap = false;
        pIVar6->ActiveIdWindow = (ImGuiWindow *)0x0;
      }
      if (((((uVar9 & 1) != 0) && (pIVar5->ActiveId == id)) &&
          (0.0 < (pIVar5->IO).MouseDownDuration[0])) && (bVar7 = IsMouseClicked(0,true), bVar7)) {
        bVar8 = true;
      }
    }
    bVar7 = true;
    if (bVar8 != false) {
      pIVar5->NavDisableHighlight = true;
    }
  }
  if (((pIVar5->NavId == id) && (pIVar5->NavDisableHighlight == false)) &&
     ((pIVar5->NavDisableMouseHover == true &&
      ((IVar2 = pIVar5->ActiveId, IVar2 == id || IVar2 == 0 || (IVar2 == window->MoveId)))))) {
    bVar7 = true;
  }
  if (pIVar5->NavActivateDownId == id) {
    IVar2 = pIVar5->NavActivateId;
    fVar11 = GetNavInputAmount(0,(uVar9 & 1) * 2 + ImGuiInputReadMode_Pressed);
    bVar10 = true;
    if ((0.0 < fVar11 || IVar2 == id) || (bVar10 = bVar8, pIVar5->ActiveId == id)) {
      bVar8 = bVar10;
      pIVar5->NavActivateId = id;
      SetActiveID(id,window);
      if ((uVar9 >> 0xd & 1) == 0) {
        SetFocusID(id,window);
      }
      pIVar5->ActiveIdAllowNavDirFlags = 0xf;
    }
  }
  pIVar6 = GImGui;
  if (pIVar5->ActiveId == id) {
    if (pIVar5->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar5->NavActivateDownId == id) {
        bVar10 = false;
      }
      else {
        bVar10 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar10;
        if (bVar10) {
          pIVar6->ActiveIdTimer = 0.0;
        }
        bVar10 = false;
        pIVar6->ActiveId = 0;
        pIVar6->ActiveIdAllowNavDirFlags = 0;
        pIVar6->ActiveIdAllowOverlap = false;
        pIVar6->ActiveIdWindow = (ImGuiWindow *)0x0;
      }
      goto LAB_0014d178;
    }
    if (pIVar5->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (pIVar5->ActiveIdIsJustActivated == true) {
        IVar1 = (pIVar5->IO).MousePos;
        IVar4.y = IVar1.y - (bb->Min).y;
        IVar4.x = IVar1.x - (bb->Min).x;
        pIVar5->ActiveIdClickOffset = IVar4;
      }
      pIVar6 = GImGui;
      bVar10 = true;
      if ((pIVar5->IO).MouseDown[0] == false) {
        bVar10 = bVar8;
        if ((bVar7 == true && (uVar9 & 2) != 0) &&
           ((((uVar9 & 1) == 0 ||
             ((pIVar5->IO).MouseDownDurationPrev[0] < (pIVar5->IO).KeyRepeatDelay)) &&
            (bVar10 = true, pIVar5->DragDropActive != false)))) {
          bVar10 = bVar8;
        }
        bVar8 = bVar10;
        bVar10 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar10;
        if (bVar10) {
          pIVar6->ActiveIdTimer = 0.0;
        }
        bVar10 = false;
        pIVar6->ActiveId = 0;
        pIVar6->ActiveIdAllowNavDirFlags = 0;
        pIVar6->ActiveIdAllowOverlap = false;
        pIVar6->ActiveIdWindow = (ImGuiWindow *)0x0;
      }
      if ((uVar9 >> 0xd & 1) == 0) {
        pIVar5->NavDisableHighlight = true;
      }
      goto LAB_0014d178;
    }
  }
  bVar10 = false;
LAB_0014d178:
  if (out_hovered != (bool *)0x0) {
    *out_hovered = bVar7;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar10;
  }
  return bVar8;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default behavior requires click+release on same spot
    if ((flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnRelease | ImGuiButtonFlags_PressedOnDoubleClick)) == 0)
        flags |= ImGuiButtonFlags_PressedOnClickRelease;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    if ((flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window)
        g.HoveredWindow = window;

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if ((flags & ImGuiButtonFlags_PressedOnDragDropHold) && g.DragDropActive && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicPressedRepeatAmount(g.HoveredIdTimer + 0.0001f, g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, 0.01f, 0.70f)) // FIXME: Our formula for CalcTypematicPressedRepeatAmount() is fishy
            {
                pressed = true;
                FocusWindow(window);
            }
        }

    if ((flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            //                        | CLICKING        | HOLDING with ImGuiButtonFlags_Repeat
            // PressedOnClickRelease  |  <on release>*  |  <on repeat> <on repeat> .. (NOT on release)  <-- MOST COMMON! (*) only if both click/release were over bounds
            // PressedOnClick         |  <on click>     |  <on click> <on repeat> <on repeat> ..
            // PressedOnRelease       |  <on release>   |  <on repeat> <on repeat> .. (NOT on release)
            // PressedOnDoubleClick   |  <on dclick>    |  <on dclick> <on repeat> <on repeat> ..
            // FIXME-NAV: We don't honor those different behaviors.
            if ((flags & ImGuiButtonFlags_PressedOnClickRelease) && g.IO.MouseClicked[0])
            {
                SetActiveID(id, window);
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                FocusWindow(window);
            }
            if (((flags & ImGuiButtonFlags_PressedOnClick) && g.IO.MouseClicked[0]) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[0]))
            {
                pressed = true;
                if (flags & ImGuiButtonFlags_NoHoldingActiveID)
                    ClearActiveID();
                else
                    SetActiveID(id, window); // Hold on ID
                FocusWindow(window);
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && g.IO.MouseReleased[0])
            {
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if ((flags & ImGuiButtonFlags_Repeat) && g.ActiveId == id && g.IO.MouseDownDuration[0] > 0.0f && IsMouseClicked(0, true))
                pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        hovered = true;

    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputPressed(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
            g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right) | (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
        }
    }

    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;
            if (g.IO.MouseDown[0])
            {
                held = true;
            }
            else
            {
                if (hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease))
                    if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                        if (!g.DragDropActive)
                            pressed = true;
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}